

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
xemmai::t_parser::f_expressions
          (t_parser *this,size_t a_indent,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  bool bVar1;
  t_token tVar2;
  t_script *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_38;
  
  local_38._M_head_impl = (t_node *)in_RAX;
  while (tVar2 = (this->v_lexer).v_token, tVar2 != c_token__ASTERISK) {
    f_expression((t_parser *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)a_nodes,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &stack0xffffffffffffffc8);
    if ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
        local_38._M_head_impl != (t_node *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    bVar1 = (this->v_lexer).v_newline;
    if ((this->v_lexer).v_token == c_token__COMMA) {
      if ((bVar1 != false) &&
         ((ulong)((long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p)
                 >> 2) < a_indent)) goto LAB_0017736c;
      t_lexer::f_next(&this->v_lexer);
    }
    else if ((bVar1 == false) ||
            ((ulong)((long)(this->v_lexer).v_indent.v_i +
                     (-0x50 - (long)(this->v_lexer).v_indent.v_p) >> 2) <= a_indent))
    goto LAB_0017736c;
  }
  t_lexer::f_next(&this->v_lexer);
  f_expression((t_parser *)&stack0xffffffffffffffc8);
  std::
  vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
  ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
            ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
              *)a_nodes,
             (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             &stack0xffffffffffffffc8);
  if ((_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_38._M_head_impl !=
      (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)0x0) {
    (*((t_body *)&(local_38._M_head_impl)->_vptr_t_node)->_vptr_t_body[1])();
  }
LAB_0017736c:
  return tVar2 == c_token__ASTERISK;
}

Assistant:

bool t_parser::f_expressions(size_t a_indent, std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	while (v_lexer.f_token() != t_lexer::c_token__ASTERISK) {
		a_nodes.push_back(f_expression());
		if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
			if (v_lexer.f_newline() && v_lexer.f_indent() < a_indent) return false;
			v_lexer.f_next();
			continue;
		}
		if (!v_lexer.f_newline() || v_lexer.f_indent() <= a_indent) return false;
	}
	v_lexer.f_next();
	a_nodes.push_back(f_expression());
	return true;
}